

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O1

int coda_pcre2_substring_length_bynumber_8
              (pcre2_match_data_8 *match_data,uint32_t stringnumber,size_t *sizeptr)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  
  iVar3 = match_data->rc;
  if (iVar3 == -2) {
    if (stringnumber != 0) {
      return -2;
    }
    iVar3 = 0;
  }
  else if (iVar3 < 0) {
    return iVar3;
  }
  if (match_data->matchedby == '\x01') {
    if (match_data->oveccount <= stringnumber) {
      return -0x36;
    }
    if (iVar3 - 1U < stringnumber) {
      return -0x37;
    }
  }
  else {
    if (match_data->code->top_bracket < stringnumber) {
      return -0x31;
    }
    if (match_data->oveccount <= stringnumber) {
      return -0x36;
    }
    if (match_data->ovector[stringnumber * 2] == 0xffffffffffffffff) {
      return -0x37;
    }
  }
  uVar1 = match_data->ovector[stringnumber * 2];
  uVar2 = match_data->ovector[(ulong)(stringnumber * 2) + 1];
  iVar3 = -0x43;
  if ((uVar2 <= match_data->subject_length && uVar1 <= match_data->subject_length) &&
     (iVar3 = 0, sizeptr != (size_t *)0x0)) {
    sVar4 = 0;
    if (uVar1 <= uVar2) {
      sVar4 = uVar2 - uVar1;
    }
    *sizeptr = sVar4;
    return iVar3;
  }
  return iVar3;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_length_bynumber(pcre2_match_data *match_data,
  uint32_t stringnumber, PCRE2_SIZE *sizeptr)
{
PCRE2_SIZE left, right;
int count = match_data->rc;
if (count == PCRE2_ERROR_PARTIAL)
  {
  if (stringnumber > 0) return PCRE2_ERROR_PARTIAL;
  count = 0;
  }
else if (count < 0) return count;            /* Match failed */

if (match_data->matchedby != PCRE2_MATCHEDBY_DFA_INTERPRETER)
  {
  if (stringnumber > match_data->code->top_bracket)
    return PCRE2_ERROR_NOSUBSTRING;
  if (stringnumber >= match_data->oveccount)
    return PCRE2_ERROR_UNAVAILABLE;
  if (match_data->ovector[stringnumber*2] == PCRE2_UNSET)
    return PCRE2_ERROR_UNSET;
  }
else  /* Matched using pcre2_dfa_match() */
  {
  if (stringnumber >= match_data->oveccount) return PCRE2_ERROR_UNAVAILABLE;
  if (count != 0 && stringnumber >= (uint32_t)count) return PCRE2_ERROR_UNSET;
  }

left = match_data->ovector[stringnumber*2];
right = match_data->ovector[stringnumber*2+1];
if (left > match_data->subject_length || right > match_data->subject_length)
  return PCRE2_ERROR_INVALIDOFFSET;
if (sizeptr != NULL) *sizeptr = (left > right)? 0 : right - left;
return 0;
}